

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O0

void clipCoverage(string *filename,string *outfile)

{
  byte bVar1;
  __type _Var2;
  ostream *this;
  runtime_error *prVar3;
  vector *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  const_reference pvVar5;
  SamHeader *in_RSI;
  string mateReferenceID;
  string referenceID;
  BamWriter writer;
  BamAlignment alignment;
  BamReader bamreader;
  undefined4 in_stack_fffffffffffffd98;
  byte in_stack_fffffffffffffd9c;
  byte in_stack_fffffffffffffd9d;
  byte in_stack_fffffffffffffd9e;
  byte in_stack_fffffffffffffd9f;
  const_reference in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdc0;
  string local_1e8 [32];
  string local_1c8 [32];
  BamWriter local_1a8 [8];
  BamAlignment local_1a0 [344];
  string local_48 [48];
  BamReader local_18 [24];
  
  BamTools::BamReader::BamReader(local_18);
  bVar1 = BamTools::BamReader::Open((string *)local_18);
  if ((bVar1 & 1) == 0) {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    this = std::operator<<((ostream *)&std::cerr,local_48);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Couldn\'t open Bamfile");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment(local_1a0);
  BamTools::BamWriter::BamWriter(local_1a8);
  pvVar4 = (vector *)BamTools::BamReader::GetConstSamHeader();
  BamTools::BamReader::GetReferenceData();
  bVar1 = BamTools::BamWriter::Open((string *)local_1a8,in_RSI,pvVar4);
  if ((bVar1 & 1) != 0) {
    while (bVar1 = BamTools::BamReader::GetNextAlignment((BamAlignment *)local_18), (bVar1 & 1) != 0
          ) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              BamTools::BamReader::GetReferenceData();
      pvVar5 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                         ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                          in_stack_fffffffffffffda0,
                          CONCAT17(in_stack_fffffffffffffd9f,
                                   CONCAT16(in_stack_fffffffffffffd9e,
                                            CONCAT15(in_stack_fffffffffffffd9d,
                                                     CONCAT14(in_stack_fffffffffffffd9c,
                                                              in_stack_fffffffffffffd98)))));
      std::__cxx11::string::string(local_1c8,(string *)pvVar5);
      BamTools::BamReader::GetReferenceData();
      in_stack_fffffffffffffda0 =
           std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                     ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                      in_stack_fffffffffffffda0,
                      CONCAT17(in_stack_fffffffffffffd9f,
                               CONCAT16(in_stack_fffffffffffffd9e,
                                        CONCAT15(in_stack_fffffffffffffd9d,
                                                 CONCAT14(in_stack_fffffffffffffd9c,
                                                          in_stack_fffffffffffffd98)))));
      std::__cxx11::string::string(local_1e8,(string *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffd9f = BamTools::BamAlignment::IsProperPair();
      if (((((in_stack_fffffffffffffd9f & 1) != 0) &&
           (in_stack_fffffffffffffd9e = BamTools::BamAlignment::IsDuplicate(),
           (in_stack_fffffffffffffd9e & 1) == 0)) &&
          (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(bVar1,in_stack_fffffffffffffdc0),__rhs), _Var2)) &&
         ((in_stack_fffffffffffffd9d = BamTools::BamAlignment::IsFailedQC(),
          (in_stack_fffffffffffffd9d & 1) == 0 &&
          (in_stack_fffffffffffffd9c = BamTools::BamAlignment::IsMapped(),
          (in_stack_fffffffffffffd9c & 1) != 0)))) {
        bVar1 = BamTools::BamAlignment::IsMateMapped();
        in_stack_fffffffffffffd98 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd98);
        if ((bVar1 & 1) != 0) {
          BamTools::BamWriter::SaveAlignment((BamAlignment *)local_1a8);
        }
      }
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_1c8);
    }
    BamTools::BamWriter::Close();
    BamTools::BamWriter::~BamWriter(local_1a8);
    BamTools::BamAlignment::~BamAlignment(local_1a0);
    BamTools::BamReader::~BamReader(local_18);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Couldn\'t open out Bamfile");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void clipCoverage(string filename, string outfile) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    BamTools::BamWriter writer;
    if (not writer.Open(outfile,bamreader.GetConstSamHeader(),bamreader.GetReferenceData())) {
            throw std::runtime_error("Couldn't open out Bamfile");
    }
    while (bamreader.GetNextAlignment(alignment)){
        string referenceID= bamreader.GetReferenceData().at(alignment.RefID).RefName;
        string mateReferenceID= bamreader.GetReferenceData().at(alignment.MateRefID).RefName;
        if (!alignment.IsProperPair() || alignment.IsDuplicate() || !(referenceID==mateReferenceID) || alignment.IsFailedQC() || !(alignment.IsMapped()&&alignment.IsMateMapped())) {
            continue;
        }
        writer.SaveAlignment(alignment);
    }
    writer.Close();
}